

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  int iVar1;
  uint uVar2;
  Parse *pPVar3;
  Op *pOVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = *pMaxFuncArgs;
  pPVar3 = p->pParse;
  pOVar4 = p->aOp;
  piVar5 = pPVar3->aLabel;
  p->field_0xc6 = p->field_0xc6 & 0x3f | 0x40;
  lVar6 = (long)p->nOp * 0x18;
  do {
    if ((&pOVar4[-1].opcode)[lVar6] < 0x41) {
      switch((&pOVar4[-1].opcode)[lVar6]) {
      case '\x02':
        if (*(int *)((long)pOVar4 + lVar6 + -0x10) != 0) {
          p->field_0xc6 = p->field_0xc6 & 0xbf;
        }
      case '\0':
      case '\x01':
        p->field_0xc6 = p->field_0xc6 | 0x80;
        break;
      case '\x03':
      case '\x04':
      case '\x05':
        p->field_0xc6 = p->field_0xc6 & 0x3f | 0x80;
        break;
      case '\x06':
        iVar1 = *(int *)((long)pOVar4 + lVar6 + -0x2c);
        if (iVar7 < iVar1) {
          iVar7 = iVar1;
        }
      default:
        uVar2 = *(uint *)((long)pOVar4 + lVar6 + -0x10);
        if ((int)uVar2 < 0) {
          *(int *)((long)pOVar4 + lVar6 + -0x10) = piVar5[~uVar2];
        }
        break;
      case '\a':
        iVar1 = *(int *)((long)pOVar4 + lVar6 + -0x10);
        if (iVar7 < iVar1) {
          iVar7 = iVar1;
        }
      }
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  if (piVar5 != (int *)0x0) {
    sqlite3DbFreeNN(p->db,pPVar3->aLabel);
    pPVar3->aLabel = (int *)0x0;
  }
  pPVar3->nLabel = 0;
  *pMaxFuncArgs = iVar7;
  return;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  while(1){

    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* no break */ deliberate_fall_through
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          /* Fall through into the default case */
          /* no break */ deliberate_fall_through
        }
#endif
        default: {
          if( pOp->p2<0 ){
            /* The mkopcodeh.tcl script has so arranged things that the only
            ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
            ** have non-negative values for P2. */
            assert( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 );
            assert( ADDR(pOp->p2)<-pParse->nLabel );
            pOp->p2 = aLabel[ADDR(pOp->p2)];
          }
          break;
        }
      }
      /* The mkopcodeh.tcl script has so arranged things that the only
      ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
      ** have non-negative values for P2. */
      assert( (sqlite3OpcodeProperty[pOp->opcode]&OPFLG_JUMP)==0 || pOp->p2>=0);
    }
    if( pOp==p->aOp ) break;
    pOp--;
  }
  if( aLabel ){
    sqlite3DbFreeNN(p->db, pParse->aLabel);
    pParse->aLabel = 0;
  }
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}